

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

void __thiscall CTxOut::CTxOut(CTxOut *this,CAmount *nValueIn,CScript scriptPubKeyIn)

{
  long lVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 0x18) = 0;
  (this->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->scriptPubKey).super_CScriptBase._union + 8) = 0;
  this->nValue = *nValueIn;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(this->scriptPubKey).super_CScriptBase,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxOut::CTxOut(const CAmount& nValueIn, CScript scriptPubKeyIn)
{
    nValue = nValueIn;
    scriptPubKey = scriptPubKeyIn;
}